

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecc-arithmetic.c
# Opt level: O0

WeierstrassPoint *
ecc_weierstrass_point_new_imported(WeierstrassCurve *wc,mp_int *monty_x,mp_int *monty_y)

{
  WeierstrassPoint *pWVar1;
  mp_int *pmVar2;
  WeierstrassPoint *wp;
  mp_int *monty_y_local;
  mp_int *monty_x_local;
  WeierstrassCurve *wc_local;
  
  pWVar1 = ecc_weierstrass_point_new_empty(wc);
  pWVar1->X = monty_x;
  pWVar1->Y = monty_y;
  pmVar2 = monty_identity(wc->mc);
  pmVar2 = mp_copy(pmVar2);
  pWVar1->Z = pmVar2;
  return pWVar1;
}

Assistant:

static WeierstrassPoint *ecc_weierstrass_point_new_imported(
    WeierstrassCurve *wc, mp_int *monty_x, mp_int *monty_y)
{
    WeierstrassPoint *wp = ecc_weierstrass_point_new_empty(wc);
    wp->X = monty_x;
    wp->Y = monty_y;
    wp->Z = mp_copy(monty_identity(wc->mc));
    return wp;
}